

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2Envelope(LWOImporter *this,uint length)

{
  uint8_t **inout;
  uint8_t *puVar1;
  pointer pEVar2;
  uint *puVar3;
  pointer pKVar4;
  uint uVar5;
  uint32_t uVar6;
  SubChunkHeader SVar7;
  Logger *this_00;
  DeadlyImportError *pDVar8;
  int *piVar9;
  char *message;
  allocator<char> local_69;
  undefined1 local_68 [16];
  _Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> local_58;
  size_t sStack_40;
  size_t local_38;
  
  if (length < 4) {
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"LWO: ENVL chunk is too small",&local_69);
    DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = this->mFileBuffer;
  local_68._0_8_ = (pointer)0x1000000000;
  local_68._8_8_ = 0x100000001;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sStack_40 = 0;
  local_38 = 0;
  std::vector<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
  emplace_back<Assimp::LWO::Envelope>(&this->mEnvelopes,(Envelope *)local_68);
  inout = &this->mFileBuffer;
  std::_Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::~_Vector_base(&local_58);
  pEVar2 = (this->mEnvelopes).
           super__Vector_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar5 = ReadVSizedIntLWO2(this,inout);
  pEVar2[-1].index = uVar5;
  piVar9 = (int *)this->mFileBuffer;
  if (this->mIsLXOB == true) {
    piVar9 = piVar9 + (*piVar9 == 0);
    *inout = (uint8_t *)piVar9;
  }
  do {
    if (puVar1 + length <= (int *)((long)piVar9 + 6)) {
      return;
    }
    SVar7 = IFF::LoadSubChunk(inout);
    puVar3 = (uint *)*inout;
    piVar9 = (int *)(((ulong)SVar7 >> 0x20 & 0xffff) + (long)puVar3);
    if (puVar1 + length < piVar9) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"LWO2: Invalid envelope chunk length",&local_69);
      DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = SVar7._4_4_ & 0xffff;
    uVar6 = SVar7.type;
    if (uVar6 == 0x4b455920) {
      if (uVar5 < 8) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"LWO: KEY chunk is too small",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = 0x100000000;
      local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_end_of_storage &
                    0xffffffff00000000);
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::
      emplace_back<Assimp::LWO::Key>(&pEVar2[-1].keys,(Key *)local_68);
      pKVar4 = pEVar2[-1].keys.
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar5 = *(uint *)*inout;
      *inout = (uint8_t *)((long)*inout + 4);
      pKVar4[-1].time =
           (double)(float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
      uVar5 = *(uint *)*inout;
      *inout = (uint8_t *)((long)*inout + 4);
      pKVar4[-1].value =
           (float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
    }
    else if (uVar6 == 0x504f5354) {
      if (uVar5 < 2) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"LWO: POST chunk is too small",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar5 = *puVar3;
      *inout = (uint8_t *)((long)puVar3 + 2);
      pEVar2[-1].post = (uint)(ushort)((ushort)uVar5 << 8 | (ushort)uVar5 >> 8);
    }
    else if (uVar6 == 0x50524520) {
      if (uVar5 < 2) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"LWO: PRE chunk is too small",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar5 = *puVar3;
      *inout = (uint8_t *)((long)puVar3 + 2);
      pEVar2[-1].pre = (uint)(ushort)((ushort)uVar5 << 8 | (ushort)uVar5 >> 8);
    }
    else if (uVar6 == 0x5350414e) {
      if (uVar5 < 4) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"LWO: SPAN chunk is too small",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pKVar4 = pEVar2[-1].keys.
               super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pKVar4 -
                  (long)pEVar2[-1].keys.
                        super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x28) < 2) {
        this_00 = DefaultLogger::get();
        message = "LWO2: Unexpected SPAN chunk";
        goto LAB_00419e04;
      }
      uVar5 = *puVar3;
      *inout = (uint8_t *)(puVar3 + 1);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if (uVar5 == 0x42455a32) {
        pKVar4[-1].inter = IT_BEZ2;
      }
      else if (uVar5 == 0x42455a49) {
        pKVar4[-1].inter = IT_BEZI;
      }
      else if (uVar5 == 0x4845524d) {
        pKVar4[-1].inter = IT_HERM;
      }
      else if (uVar5 == 0x4c494e45) {
        pKVar4[-1].inter = IT_LINE;
      }
      else if (uVar5 == 0x54434220) {
        pKVar4[-1].inter = IT_TCB;
      }
      else {
        if (uVar5 != 0x53544550) {
          this_00 = DefaultLogger::get();
          message = "LWO2: Unknown interval interpolation mode";
          goto LAB_00419e04;
        }
        pKVar4[-1].inter = IT_STEP;
      }
    }
    else if (uVar6 == 0x54595045) {
      if (uVar5 < 2) {
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,"LWO: TYPE chunk is too small",&local_69);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)local_68);
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      *inout = (uint8_t *)((long)puVar3 + 1);
      pEVar2[-1].type = (uint)*(byte *)((long)puVar3 + 1);
      *inout = *inout + 1;
    }
    else {
      this_00 = DefaultLogger::get();
      message = "LWO2: Encountered unknown ENVL subchunk";
LAB_00419e04:
      Logger::warn(this_00,message);
    }
    *inout = (uint8_t *)piVar9;
  } while( true );
}

Assistant:

void LWOImporter::LoadLWO2Envelope(unsigned int length)
{
    LE_NCONST uint8_t* const end = mFileBuffer + length;
    AI_LWO_VALIDATE_CHUNK_LENGTH(length,ENVL,4);

    mEnvelopes.push_back(LWO::Envelope());
    LWO::Envelope& envelope = mEnvelopes.back();

    // Get the index of the envelope
    envelope.index = ReadVSizedIntLWO2(mFileBuffer);

    // It looks like there might be an extra U4 right after the index,
    // at least in modo (LXOB) files: we'll ignore it if it's zero,
    // otherwise it represents the start of a subchunk, so we backtrack.
    if (mIsLXOB)
    {
        uint32_t extra = GetU4();
        if (extra)
        {
            mFileBuffer -= 4;
        }
    }

    // ... and read all subchunks
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid envelope chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // Type & representation of the envelope
        case AI_LWO_TYPE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TYPE,2);
            mFileBuffer++; // skip user format

            // Determine type of envelope
            envelope.type  = (LWO::EnvelopeType)*mFileBuffer;
            ++mFileBuffer;
            break;

            // precondition
        case AI_LWO_PRE:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,PRE,2);
            envelope.pre = (LWO::PrePostBehaviour)GetU2();
            break;

            // postcondition
        case AI_LWO_POST:
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,POST,2);
            envelope.post = (LWO::PrePostBehaviour)GetU2();
            break;

            // keyframe
        case AI_LWO_KEY:
            {
            AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,KEY,8);

            envelope.keys.push_back(LWO::Key());
            LWO::Key& key = envelope.keys.back();

            key.time = GetF4();
            key.value = GetF4();
            break;
            }

            // interval interpolation
        case AI_LWO_SPAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPAN,4);
                if (envelope.keys.size()<2)
                    ASSIMP_LOG_WARN("LWO2: Unexpected SPAN chunk");
                else {
                    LWO::Key& key = envelope.keys.back();
                    switch (GetU4())
                    {
                        case AI_LWO_STEP:
                            key.inter = LWO::IT_STEP;break;
                        case AI_LWO_LINE:
                            key.inter = LWO::IT_LINE;break;
                        case AI_LWO_TCB:
                            key.inter = LWO::IT_TCB;break;
                        case AI_LWO_HERM:
                            key.inter = LWO::IT_HERM;break;
                        case AI_LWO_BEZI:
                            key.inter = LWO::IT_BEZI;break;
                        case AI_LWO_BEZ2:
                            key.inter = LWO::IT_BEZ2;break;
                        default:
                            ASSIMP_LOG_WARN("LWO2: Unknown interval interpolation mode");
                    };

                    // todo ... read params
                }
                break;
            }

        default:
            ASSIMP_LOG_WARN("LWO2: Encountered unknown ENVL subchunk");
            break;
        }
        // regardless how much we did actually read, go to the next chunk
        mFileBuffer = next;
    }
}